

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

bool __thiscall Memory::Recycler::EndMarkCheckOOMRescan(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool bVar4;
  
  if (this->needOOMRescan == true) {
    if (this->objectGraphDumper == (RecyclerObjectGraphDumper *)0x0) {
      EndMarkOnLowMemory(this);
      bVar4 = true;
    }
    else {
      this->objectGraphDumper->isOutOfMemory = true;
      bVar4 = false;
      this->needOOMRescan = false;
      (((this->markContext).pagePool)->pageAllocator).disableAllocationOutOfMemory = false;
      (((this->parallelMarkContext1).pagePool)->pageAllocator).disableAllocationOutOfMemory = false;
      (((this->parallelMarkContext2).pagePool)->pageAllocator).disableAllocationOutOfMemory = false;
      (((this->parallelMarkContext3).pagePool)->pageAllocator).disableAllocationOutOfMemory = false;
    }
  }
  else {
    bVar4 = false;
  }
  bVar2 = HasPendingMarkObjects(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xacd,"(!HasPendingMarkObjects())","!HasPendingMarkObjects()");
    if (!bVar2) goto LAB_00719c43;
    *puVar3 = 0;
  }
  bVar2 = HasPendingTrackObjects(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xace,"(!HasPendingTrackObjects())","!HasPendingTrackObjects()");
    if (!bVar2) {
LAB_00719c43:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return bVar4;
}

Assistant:

bool
Recycler::EndMarkCheckOOMRescan()
{
    bool oomRescan = false;
    if (this->NeedOOMRescan())
    {
#ifdef RECYCLER_DUMP_OBJECT_GRAPH
        if (this->objectGraphDumper)
        {
            // Do not complete the mark if we are just dumping the object graph
            // Just report out of memory
            this->objectGraphDumper->isOutOfMemory = true;
            this->ClearNeedOOMRescan();
        }
        else
#endif
        {
            EndMarkOnLowMemory();
            oomRescan = true;
        }
    }

    // Done with the mark stack, it should be empty.
    // Release pages it is holding.
    Assert(!HasPendingMarkObjects());
    Assert(!HasPendingTrackObjects());
    return oomRescan;
}